

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdCelsiusLightingEnable::~MthdCelsiusLightingEnable
          (MthdCelsiusLightingEnable *this)

{
  MthdCelsiusLightingEnable *this_local;
  
  ~MthdCelsiusLightingEnable(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff;
			if (rnd() & 1) {
				val &= 0xf;
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
	}